

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_disto.c
# Opt level: O2

size_t ReadPicture(char *filename,WebPPicture *pic,int keep_alpha)

{
  bool bVar1;
  int iVar2;
  WebPImageReader p_Var3;
  size_t data_size;
  uint8_t *data;
  
  data = (uint8_t *)0x0;
  data_size = 0;
  iVar2 = ImgIoUtilReadFile(filename,&data,&data_size);
  if (iVar2 != 0) {
    pic->use_argb = 1;
    p_Var3 = WebPGuessImageReader(data,data_size);
    bVar1 = false;
    iVar2 = (*p_Var3)(data,data_size,pic,1,(Metadata *)0x0);
    if (iVar2 != 0) goto LAB_00104106;
  }
  fprintf(stderr,"Error! Could not process file %s\n",filename);
  bVar1 = true;
LAB_00104106:
  free(data);
  if (bVar1) {
    data_size = 0;
  }
  return data_size;
}

Assistant:

static size_t ReadPicture(const char* const filename, WebPPicture* const pic,
                          int keep_alpha) {
  const uint8_t* data = NULL;
  size_t data_size = 0;
  WebPImageReader reader = NULL;
  int ok = ImgIoUtilReadFile(filename, &data, &data_size);
  if (!ok) goto End;

  pic->use_argb = 1;  // force ARGB

#ifdef HAVE_WINCODEC_H
  // Try to decode the file using WIC falling back to the other readers for
  // e.g., WebP.
  ok = ReadPictureWithWIC(filename, pic, keep_alpha, NULL);
  if (ok) goto End;
#endif
  reader = WebPGuessImageReader(data, data_size);
  ok = reader(data, data_size, pic, keep_alpha, NULL);

 End:
  if (!ok) {
    WFPRINTF(stderr, "Error! Could not process file %s\n",
             (const W_CHAR*)filename);
  }
  free((void*)data);
  return ok ? data_size : 0;
}